

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s.hpp
# Opt level: O3

void __thiscall
estl::vector_s<std::__cxx11::string,10ul>::shift_right<std::__cxx11::string*>
          (vector_s<std::__cxx11::string,10ul> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *first,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *last,size_type n)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_type sVar3;
  
  if (-1 < (long)last - (long)first) {
    if (n != 0) {
      paVar2 = &last->field_2;
      sVar3 = n;
      do {
        (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(paVar2 + -1))->
        _M_dataplus)._M_p = (pointer)paVar2;
        *(size_type *)((long)paVar2 + -8) = 0;
        paVar2->_M_local_buf[0] = '\0';
        paVar2 = paVar2 + 2;
        sVar3 = sVar3 - 1;
      } while (sVar3 != 0);
    }
    if (last != first) {
      do {
        pbVar1 = last + -1;
        std::__cxx11::string::operator=((string *)(last + (n - 1)),(string *)pbVar1);
        last = pbVar1;
      } while (pbVar1 != first);
    }
  }
  return;
}

Assistant:

void shift_right(InputIt first, InputIt last, size_type n)
    {
        const long diff_signed = last - first;
        if (diff_signed < 0) {
            return;
        }

        // Make room for elements
        for (size_type i = 0; i < n; ++i) {
            const pointer insert_ptr = last + i;
            new (insert_ptr) value_type(); // Default contruct the extra elements needed. Could perhaps construct when first needed instead!
        }

        for (InputIt it = last; it != first;) {
            --it;
            *(it+n) = std::move(*it);
        }
    }